

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O0

void __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::ConvertToRealMap(small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                   *this)

{
  pair<const_unsigned_long,_ctemplate::TemplateString> *ppVar1;
  map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>
  *this_00;
  int local_c0;
  int local_bc;
  int i_1;
  int i;
  ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> temp_array [4];
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *this_local;
  
  for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
    ppVar1 = ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>::
             operator*((ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>
                        *)((long)&this->field_2 + (long)local_bc * 0x28));
    ManualConstructor<std::pair<unsigned_long_const,ctemplate::TemplateString>>::
    Init<std::pair<unsigned_long_const,ctemplate::TemplateString>>
              ((ManualConstructor<std::pair<unsigned_long_const,ctemplate::TemplateString>> *)
               (&i_1 + (long)local_bc * 10),ppVar1);
    ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>::Destroy
              ((ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
               ((long)&this->field_2 + (long)local_bc * 0x28));
  }
  this->size_ = -1;
  TemplateDictionary::map_arena_init::operator()(&this->functor_,&(this->field_2).map_);
  for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
    this_00 = (map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>
               *)ManualConstructor<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>_>
                 ::operator->(&(this->field_2).map_);
    ppVar1 = ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>::
             operator*((ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>
                        *)(&i_1 + (long)local_c0 * 10));
    std::
    map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>
    ::insert<std::pair<unsigned_long_const,ctemplate::TemplateString>&>(this_00,ppVar1);
    ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>::Destroy
              ((ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)
               (&i_1 + (long)local_c0 * 10));
  }
  return;
}

Assistant:

void ConvertToRealMap() {
    // Move the current elements into a temporary array.
    ManualConstructor<value_type> temp_array[kArraySize];

    for (int i = 0; i < kArraySize; i++) {
      temp_array[i].Init(*array_[i]);
      array_[i].Destroy();
    }

    // Initialize the map.
    size_ = -1;
    functor_(&map_);

    // Insert elements into it.
    for (int i = 0; i < kArraySize; i++) {
      map_->insert(*temp_array[i]);
      temp_array[i].Destroy();
    }
  }